

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RepulsivePower.cpp
# Opt level: O0

void __thiscall OpenMD::RepulsivePower::RepulsivePower(RepulsivePower *this)

{
  undefined8 *in_RDI;
  VanDerWaalsInteraction *in_stack_ffffffffffffffb0;
  allocator<char> *in_stack_ffffffffffffffe0;
  char *in_stack_ffffffffffffffe8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffff0;
  
  VanDerWaalsInteraction::VanDerWaalsInteraction(in_stack_ffffffffffffffb0);
  *in_RDI = &PTR__RepulsivePower_005046c0;
  *(undefined1 *)(in_RDI + 1) = 0;
  std::set<int,_std::less<int>,_std::allocator<int>_>::set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)0x3ac768);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x3ac77b);
  std::
  vector<std::vector<OpenMD::RPInteractionData,_std::allocator<OpenMD::RPInteractionData>_>,_std::allocator<std::vector<OpenMD::RPInteractionData,_std::allocator<OpenMD::RPInteractionData>_>_>_>
  ::vector((vector<std::vector<OpenMD::RPInteractionData,_std::allocator<OpenMD::RPInteractionData>_>,_std::allocator<std::vector<OpenMD::RPInteractionData,_std::allocator<OpenMD::RPInteractionData>_>_>_>
            *)0x3ac78e);
  in_RDI[0xe] = 0;
  std::set<OpenMD::AtomType_*,_OpenMD::AtomTypeCompare,_std::allocator<OpenMD::AtomType_*>_>::set
            ((set<OpenMD::AtomType_*,_OpenMD::AtomTypeCompare,_std::allocator<OpenMD::AtomType_*>_>
              *)0x3ac7a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffff7);
  return;
}

Assistant:

RepulsivePower::RepulsivePower() :
      initialized_(false), forceField_(NULL), name_("RepulsivePower") {}